

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

void Assimp::FindSceneCenter(aiScene *scene,aiVector3D *out,aiVector3D *min,aiVector3D *max)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  aiVector3D tmax;
  aiVector3D tmin;
  aiVector3D tout;
  aiVector3D local_60;
  aiVector3D local_54;
  aiVector3D *local_48;
  aiVector3D local_3c;
  
  if ((scene != (aiScene *)0x0) && (scene->mNumMeshes != 0)) {
    local_48 = out;
    FindMeshCenter(*scene->mMeshes,out,min,max);
    if (1 < scene->mNumMeshes) {
      uVar5 = 1;
      do {
        local_3c.x = 0.0;
        local_3c.y = 0.0;
        local_3c.z = 0.0;
        local_54.x = 0.0;
        local_54.y = 0.0;
        local_54.z = 0.0;
        local_60.x = 0.0;
        local_60.y = 0.0;
        local_60.z = 0.0;
        FindMeshCenter(scene->mMeshes[uVar5],&local_3c,&local_54,&local_60);
        if (local_54.x < min->x) {
          min->x = local_54.x;
        }
        if (local_54.y < min->y) {
          min->y = local_54.y;
        }
        if (local_54.z < min->z) {
          min->z = local_54.z;
        }
        if (max->x <= local_60.x && local_60.x != max->x) {
          max->x = local_60.x;
        }
        if (max->y <= local_60.y && local_60.y != max->y) {
          max->y = local_60.y;
        }
        if (max->z <= local_60.z && local_60.z != max->z) {
          max->z = local_60.z;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < scene->mNumMeshes);
    }
    fVar1 = max->y;
    fVar2 = min->y;
    fVar3 = max->z;
    fVar4 = min->z;
    local_48->x = (max->x - min->x) * 0.5 + min->x;
    local_48->y = (fVar1 - fVar2) * 0.5 + fVar2;
    local_48->z = (fVar3 - fVar4) * 0.5 + fVar4;
  }
  return;
}

Assistant:

void FindSceneCenter (aiScene* scene, aiVector3D& out, aiVector3D& min, aiVector3D& max) {
    if ( NULL == scene ) {
        return;
    }

    if ( 0 == scene->mNumMeshes ) {
        return;
    }
    FindMeshCenter(scene->mMeshes[0], out, min, max);
    for (unsigned int i = 1; i < scene->mNumMeshes; ++i) {
        aiVector3D tout, tmin, tmax;
        FindMeshCenter(scene->mMeshes[i], tout, tmin, tmax);
        if (min[0] > tmin[0]) min[0] = tmin[0];
        if (min[1] > tmin[1]) min[1] = tmin[1];
        if (min[2] > tmin[2]) min[2] = tmin[2];
        if (max[0] < tmax[0]) max[0] = tmax[0];
        if (max[1] < tmax[1]) max[1] = tmax[1];
        if (max[2] < tmax[2]) max[2] = tmax[2];
    }
    out = min + (max-min)*(ai_real)0.5;
}